

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<unsigned_long,int>
          (String *__return_storage_ptr__,detail *this,unsigned_long *lhs,char *op,int *rhs)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char *__dest;
  anon_union_24_2_13149d16_for_String_3 local_88;
  anon_union_24_2_13149d16_for_String_3 local_70;
  anon_union_24_2_13149d16_for_String_3 local_58;
  anon_union_24_2_13149d16_for_String_3 local_40;
  
  poVar2 = tlssPush();
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tlssPop();
  sVar3 = strlen((char *)lhs);
  __dest = String::allocate((String *)&local_70.data,(size_type)sVar3);
  memcpy(__dest,lhs,sVar3 & 0xffffffff);
  operator+((String *)&local_40.data,(String *)&local_58.data,(String *)&local_70.data);
  iVar1 = *(int *)op;
  poVar2 = tlssPush();
  std::ostream::operator<<(poVar2,iVar1);
  tlssPop();
  operator+(__return_storage_ptr__,(String *)&local_40.data,(String *)&local_88.data);
  if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
    operator_delete__(local_88.data.ptr);
  }
  if ((local_40.buf[0x17] < '\0') && (local_40.data.ptr != (char *)0x0)) {
    operator_delete__(local_40.data.ptr);
  }
  if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
    operator_delete__(local_70.data.ptr);
  }
  if ((local_58.buf[0x17] < '\0') && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }